

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall crnlib::mipmapped_texture::flip_y_helper(mipmapped_texture *this)

{
  vector<crnlib::mip_level_*> *pvVar1;
  bool bVar2;
  uint m;
  ulong uVar3;
  uint l;
  ulong uVar4;
  ulong uVar5;
  
  for (uVar4 = 0; uVar5 = (ulong)(this->m_faces).m_size, uVar4 < uVar5; uVar4 = uVar4 + 1) {
    uVar3 = 0;
    while (pvVar1 = (this->m_faces).m_p, uVar3 < pvVar1[uVar4].m_size) {
      bVar2 = mip_level::flip_y(pvVar1[uVar4].m_p[uVar3]);
      uVar3 = uVar3 + 1;
      if (!bVar2) goto LAB_00135335;
    }
  }
LAB_00135335:
  return uVar5 <= uVar4;
}

Assistant:

bool mipmapped_texture::flip_y_helper() {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      if (!m_faces[l][m]->flip_y())
        return false;

  return true;
}